

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O2

char * Qentem::TestOutPut::GetColor(Colors color)

{
  char *pcVar1;
  
  pcVar1 = "";
  if ((color < 4) && (IsColored()::isColored != '\0')) {
    pcVar1 = &DAT_0012308c + *(int *)(&DAT_0012308c + (ulong)color * 4);
  }
  return pcVar1;
}

Assistant:

QENTEM_NOINLINE static const char *GetColor(Colors color) noexcept {
        if (IsColored()) {
            switch (color) {
                case Colors::TITLE:
                    return "\x1B[36m";
                case Colors::ERROR:
                    return "\x1B[31m";
                case Colors::PASS:
                    return "\x1B[32m";
                case Colors::END:
                    return "\x1B[0m";
            }
        }

        return "";
    }